

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,8u>>(int bias)

{
  ulong uVar1;
  ulong uVar2;
  Counter<unsigned_long,_64U> fullOriginal;
  ulong uVar3;
  ulong uVar4;
  uint recent;
  ulong uVar5;
  int delta;
  ulong uVar6;
  unsigned_long absDiff;
  
  for (uVar3 = 0; uVar3 != 0x200; uVar3 = uVar3 + 1) {
    uVar4 = uVar3 & 0xff;
    for (uVar5 = 0; uVar5 != 0x200; uVar5 = uVar5 + 1) {
      if (uVar5 < uVar3) {
        if ((long)(uVar3 - uVar5) < (long)(0x80 - bias)) {
LAB_001023dc:
          uVar6 = (uint)uVar5 & 0x100 | uVar4;
          uVar1 = uVar5 & 0xff;
          if (uVar1 < uVar4) {
            uVar2 = uVar6 - 0x100;
            if (uVar4 - uVar1 < 0x80U - (long)bias) {
              uVar2 = uVar6;
            }
          }
          else {
            uVar2 = uVar6 + 0x100;
            if (uVar1 - uVar4 <= (long)bias + 0x80U) {
              uVar2 = uVar6;
            }
          }
          if ((uVar2 != uVar3) ||
             ((bias == 0 && ((long)(char)((char)uVar3 - (char)uVar5) + uVar5 != uVar3))))
          goto LAB_00102441;
        }
      }
      else if ((long)(uVar5 - uVar3) <= (long)(bias + 0x80)) goto LAB_001023dc;
    }
  }
LAB_00102441:
  return 0x1ff < uVar3;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}